

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# acecTree.c
# Opt level: O3

Vec_Int_t * Acec_TreeCarryMap(Gia_Man_t *p,Vec_Int_t *vAdds,Vec_Wec_t *vBoxes)

{
  int iVar1;
  int iVar2;
  int iVar3;
  Vec_Int_t *pVVar4;
  int *piVar5;
  int iVar6;
  Vec_Int_t *pVVar7;
  int *__s;
  ulong uVar8;
  long lVar9;
  uint uVar10;
  
  iVar1 = p->nObjs;
  pVVar7 = (Vec_Int_t *)malloc(0x10);
  iVar6 = 0x10;
  if (0xe < iVar1 - 1U) {
    iVar6 = iVar1;
  }
  pVVar7->nCap = iVar6;
  if (iVar6 == 0) {
    pVVar7->pArray = (int *)0x0;
    pVVar7->nSize = iVar1;
  }
  else {
    __s = (int *)malloc((long)iVar6 << 2);
    pVVar7->pArray = __s;
    pVVar7->nSize = iVar1;
    if (__s != (int *)0x0) {
      memset(__s,0xff,(long)iVar1 << 2);
      goto LAB_00680d1e;
    }
  }
  __s = (int *)0x0;
LAB_00680d1e:
  iVar6 = vBoxes->nSize;
  if (0 < (long)iVar6) {
    pVVar4 = vBoxes->pArray;
    uVar8 = 0;
    do {
      if (0 < pVVar4[uVar8].nSize) {
        piVar5 = pVVar4[uVar8].pArray;
        lVar9 = 0;
        do {
          iVar2 = piVar5[lVar9];
          if ((iVar2 < 0) || (uVar10 = iVar2 * 6 + 4, vAdds->nSize <= (int)uVar10)) {
            __assert_fail("i >= 0 && i < p->nSize",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/misc/vec/vecInt.h"
                          ,0x1a9,"int Vec_IntEntry(Vec_Int_t *, int)");
          }
          iVar3 = vAdds->pArray[uVar10];
          if (((long)iVar3 < 0) || (iVar1 <= iVar3)) {
            __assert_fail("i >= 0 && i < p->nSize",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/misc/vec/vecInt.h"
                          ,0x1cb,"void Vec_IntWriteEntry(Vec_Int_t *, int, int)");
          }
          __s[iVar3] = iVar2;
          lVar9 = lVar9 + 1;
        } while (lVar9 < pVVar4[uVar8].nSize);
      }
      uVar8 = uVar8 + 1;
    } while (uVar8 < (ulong)(long)iVar6);
  }
  return pVVar7;
}

Assistant:

Vec_Int_t * Acec_TreeCarryMap( Gia_Man_t * p, Vec_Int_t * vAdds, Vec_Wec_t * vBoxes )
{
    Vec_Int_t * vMap = Vec_IntStartFull( Gia_ManObjNum(p) );
    Vec_Int_t * vLevel;
    int i, k, Box;
    Vec_WecForEachLevel( vBoxes, vLevel, i )
        Vec_IntForEachEntry( vLevel, Box, k )
            Vec_IntWriteEntry( vMap, Vec_IntEntry(vAdds, 6*Box+4), Box );
    return vMap;
}